

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

bool __thiscall wasm::ExecutionResults::operator==(ExecutionResults *this,ExecutionResults *other)

{
  _Rb_tree_node_base *__k;
  __index_type _Var1;
  pointer pLVar2;
  size_t sVar3;
  ExecutionResults *this_00;
  bool bVar4;
  ulong uVar5;
  iterator iVar6;
  ostream *poVar7;
  mapped_type *pmVar8;
  SmallVector<wasm::Literal,_1UL> *other_00;
  SmallVector<wasm::Literal,_1UL> *other_01;
  _Base_ptr p_Var9;
  ulong uVar10;
  char *in_RCX;
  uint uVar11;
  ulong uVar12;
  Name name;
  Name name_00;
  SmallVector<wasm::Literal,_1UL> local_e8;
  SmallVector<wasm::Literal,_1UL> local_b0;
  Literal local_78;
  Literal local_60;
  _Base_ptr local_48;
  ExecutionResults *local_40;
  _Rb_tree_node_base *local_38;
  
  if ((this->ignore == false) && (other->ignore != true)) {
    local_38 = &(other->results)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48 = &(this->results)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_40 = this;
    for (p_Var9 = (other->results)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        this_00 = local_40, p_Var9 != local_38; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9))
    {
      __k = p_Var9 + 1;
      iVar6 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
              ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                      *)local_40,(key_type *)__k);
      if (iVar6._M_node == local_48) {
        poVar7 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] missing ");
        name_00.super_IString.str._M_str = in_RCX;
        name_00.super_IString.str._M_len = (size_t)p_Var9[1]._M_parent;
        poVar7 = wasm::operator<<((wasm *)poVar7,*(ostream **)(p_Var9 + 1),name_00);
        std::operator<<(poVar7,'\n');
        goto LAB_001d8707;
      }
      poVar7 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] comparing ");
      name.super_IString.str._M_str = in_RCX;
      name.super_IString.str._M_len = (size_t)p_Var9[1]._M_parent;
      poVar7 = wasm::operator<<((wasm *)poVar7,*(ostream **)(p_Var9 + 1),name);
      std::operator<<(poVar7,'\n');
      pmVar8 = std::
               map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
               ::operator[](&this_00->results,(key_type *)__k);
      _Var1 = (pmVar8->
              super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
              ).
              super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
              .
              super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
              .
              super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
              .
              super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
              .
              super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
              ._M_index;
      pmVar8 = std::
               map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
               ::operator[](&other->results,(key_type *)__k);
      if (_Var1 != (pmVar8->
                   super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   ).
                   super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   .
                   super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                   ._M_index) goto LAB_001d8707;
      other_00 = (SmallVector<wasm::Literal,_1UL> *)
                 std::
                 map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                 ::operator[](&this_00->results,(key_type *)__k);
      sVar3 = other_00[1].usedFixed;
      other_01 = (SmallVector<wasm::Literal,_1UL> *)
                 std::
                 map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                 ::operator[](&other->results,(key_type *)__k);
      if ((char)sVar3 == '\0' && (char)other_01[1].usedFixed == '\0') {
        SmallVector<wasm::Literal,_1UL>::SmallVector(&local_e8,other_00);
        SmallVector<wasm::Literal,_1UL>::SmallVector(&local_b0,other_01);
        bVar4 = areEqual(local_40,(Literals *)&local_e8,(Literals *)&local_b0);
        SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_b0);
        SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_e8);
        if (!bVar4) goto LAB_001d8707;
      }
    }
    if ((long)(local_40->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(local_40->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(other->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(other->loggings).super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
              _M_impl.super__Vector_impl_data._M_start) {
      uVar11 = 0;
      do {
        uVar12 = (ulong)uVar11;
        pLVar2 = (this_00->loggings).
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(this_00->loggings).
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pLVar2) / 0x18;
        uVar5 = CONCAT71((int7)(uVar10 >> 8),uVar10 <= uVar12);
        if (uVar10 <= uVar12) break;
        local_38 = (_Rb_tree_node_base *)CONCAT44(local_38._4_4_,(int)uVar5);
        ::wasm::Literal::Literal(&local_60,pLVar2 + uVar12);
        ::wasm::Literal::Literal
                  (&local_78,
                   (other->loggings).
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar12);
        bVar4 = areEqual(this_00,&local_60,&local_78);
        ::wasm::Literal::~Literal(&local_78);
        ::wasm::Literal::~Literal(&local_60);
        uVar11 = uVar11 + 1;
        uVar5 = (ulong)local_38 & 0xffffffff;
      } while (bVar4);
    }
    else {
      std::operator<<((ostream *)&std::cout,"logging counts not identical!\n");
LAB_001d8707:
      uVar5 = 0;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"ignoring comparison of ExecutionResults!\n");
    uVar5 = 1;
  }
  return SUB81(uVar5,0);
}

Assistant:

bool operator==(ExecutionResults& other) {
    if (ignore || other.ignore) {
      std::cout << "ignoring comparison of ExecutionResults!\n";
      return true;
    }
    for (auto& [name, _] : other.results) {
      if (results.find(name) == results.end()) {
        std::cout << "[fuzz-exec] missing " << name << '\n';
        return false;
      }
      std::cout << "[fuzz-exec] comparing " << name << '\n';
      if (results[name].index() != other.results[name].index()) {
        return false;
      }
      auto* values = std::get_if<Literals>(&results[name]);
      auto* otherValues = std::get_if<Literals>(&other.results[name]);
      if (values && otherValues && !areEqual(*values, *otherValues)) {
        return false;
      }
    }
    if (loggings.size() != other.loggings.size()) {
      std::cout << "logging counts not identical!\n";
      return false;
    }
    for (Index i = 0; i < loggings.size(); i++) {
      if (!areEqual(loggings[i], other.loggings[i])) {
        return false;
      }
    }
    return true;
  }